

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config-c.cpp
# Opt level: O1

duckdb_state duckdb_get_config_flag(size_t index,char **out_name,char **out_description)

{
  idx_t iVar1;
  long lVar2;
  char *pcVar3;
  optional_ptr<const_duckdb::ConfigurationOption,_true> option;
  optional_ptr<const_duckdb::ConfigurationOption,_true> local_20;
  
  local_20 = duckdb::DBConfig::GetOptionByIndex(index);
  if (local_20.ptr == (ConfigurationOption *)0x0) {
    iVar1 = duckdb::DBConfig::GetOptionCount();
    lVar2 = (index - iVar1) * 0x60;
    if (0x3d < index - iVar1) {
      return DuckDBError;
    }
    if (out_name != (char **)0x0) {
      *out_name = "azure_account_name" + lVar2;
    }
    if (out_description == (char **)0x0) {
      return DuckDBSuccess;
    }
    pcVar3 = &UNK_013b6f80 + lVar2;
  }
  else {
    if (out_name != (char **)0x0) {
      duckdb::optional_ptr<const_duckdb::ConfigurationOption,_true>::CheckValid(&local_20);
      *out_name = (local_20.ptr)->name;
    }
    if (out_description == (char **)0x0) {
      return DuckDBSuccess;
    }
    duckdb::optional_ptr<const_duckdb::ConfigurationOption,_true>::CheckValid(&local_20);
    pcVar3 = (local_20.ptr)->description;
  }
  *out_description = pcVar3;
  return DuckDBSuccess;
}

Assistant:

duckdb_state duckdb_get_config_flag(size_t index, const char **out_name, const char **out_description) {
	auto option = DBConfig::GetOptionByIndex(index);
	if (option) {
		if (out_name) {
			*out_name = option->name;
		}
		if (out_description) {
			*out_description = option->description;
		}
		return DuckDBSuccess;
	}

	// extension index?
	auto entry = duckdb::ExtensionHelper::GetArrayEntry(duckdb::EXTENSION_SETTINGS, index - DBConfig::GetOptionCount());
	if (!entry) {
		return DuckDBError;
	}
	if (out_name) {
		*out_name = entry->name;
	}
	if (out_description) {
		*out_description = entry->extension;
	}
	return DuckDBSuccess;
}